

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BERDecode.cpp
# Opt level: O2

int __thiscall ComplexType::fromBuffer(ComplexType *this,uint8_t *buf,size_t max_len)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  byte *pbVar5;
  ulong uStack_60;
  shared_ptr<BER_CONTAINER> newObj;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  uVar3 = BER_CONTAINER::fromBuffer(&this->super_BER_CONTAINER,buf,max_len);
  uStack_60 = (ulong)uVar3;
  if (-1 < (int)uVar3) {
    pbVar5 = buf + uStack_60;
    uVar4 = 1;
    do {
      iVar1 = (this->super_BER_CONTAINER)._length;
      if ((max_len < uVar4) || ((ulong)(long)iVar1 <= uVar4)) {
        return iVar1 + 2;
      }
      createObjectForType((ComplexType *)&newObj,(uint)*pbVar5);
      if (newObj.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        uStack_60 = 0xfffffffffffffff2;
LAB_00157cec:
        bVar2 = false;
      }
      else {
        uVar3 = (*(newObj.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  _vptr_BER_CONTAINER[4])
                          (newObj.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr,pbVar5,max_len - uVar4);
        if ((int)uVar3 < 0) {
          uStack_60 = 0xfffffffffffffff3;
          goto LAB_00157cec;
        }
        addValueToList((ComplexType *)&stack0xffffffffffffffc0,(shared_ptr<BER_CONTAINER> *)this);
        Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
        pbVar5 = pbVar5 + uVar3;
        uVar4 = uVar4 + uVar3;
        bVar2 = true;
      }
      uVar3 = (uint)uStack_60;
      Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&newObj.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    } while (bVar2);
  }
  return uVar3;
}

Assistant:

int ComplexType::fromBuffer(const uint8_t *buf, size_t max_len){
    int j = BER_CONTAINER::fromBuffer(buf, max_len);
    CHECK_DECODE_ERR(j);
    const uint8_t* ptr = buf + j;

    size_t i = 1;
    while(i < (size_t)_length && i <= max_len){
        ASN_TYPE valueType = (ASN_TYPE)*ptr;

        auto newObj = ComplexType::createObjectForType(valueType);
        if(!newObj){
            SNMP_LOGD("Couldn't create object of type: %d\n", valueType);
            return SNMP_BUFFER_ERROR_UNKNOWN_TYPE;
        }

        int used_length = newObj->fromBuffer(ptr, max_len - i);
        if(used_length < 0){
            // Problem de-serialising
            SNMP_LOGD("Problem deserialising structure of type: %d\n", valueType);
            return SNMP_BUFFER_ERROR_PROBLEM_DESERIALISING;
        }

        addValueToList(newObj);

        ptr += used_length; 
        i += used_length;
    }
    return _length + 2;
}